

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<unsigned_int,unsigned_long_long>(void)

{
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  unsigned_long_long in_stack_ffffffffffffffa8;
  unsigned_long_long u;
  ulong local_48;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_3c;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  
  u = 0;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::
  SafeInt<unsigned_long_long>(&local_3c,&u);
  su.m_int = u;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::
  SafeInt<unsigned_long_long>(&st2,&su);
  local_3c.m_int = 0;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_3c
             ,&u);
  if (su.m_int._4_4_ == 0) {
    local_3c.m_int = st2.m_int;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_3c,u);
    if ((int)((ulong)local_3c.m_int * (ulong)st2.m_int >> 0x20) == 0) {
      operator*(u,local_3c);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,u);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,su);
      u = 1;
      local_48._0_4_ = 1;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,(int *)&local_48);
      local_48._0_4_ = 1;
      SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter> *
                 )&su,(int *)&local_48);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,u);
      local_48._0_4_ = 1;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
                 (int *)&local_48);
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                (&local_3c,st2);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,u);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,su);
      u = 1;
      local_48._0_4_ = 1;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
                 (int *)&local_48);
      local_48._0_4_ = 1;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,(int *)&local_48);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,u);
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
                (&local_3c,st2);
      operator/(u,local_3c);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,u);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,su);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,u);
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
                (&local_3c,st2);
      operator+(u,local_3c);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,u);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,su);
      local_48._0_4_ = 0;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,(int *)&local_48);
      u = 0;
      local_48._0_4_ = 0;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
                 (int *)&local_48);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,u);
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
                (&local_3c,st2);
      operator-(in_stack_ffffffffffffffa8,
                (SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,u);
      local_48._0_4_ = 1;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,(int *)&local_48);
      local_48._0_4_ = 1;
      SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter> *
                 )&su,(int *)&local_48);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,su);
      u = 1;
      local_48 = CONCAT44(local_48._4_4_,1);
      SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter> *
                 )&su,(int *)&local_48);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,u);
      SVar1 = SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                        ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)&local_3c,su);
      operator<<(SVar1.m_int,su);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,u);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,su);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,u);
      SVar1 = SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                        ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)&local_3c,su);
      operator>>(SVar1.m_int,su);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,u);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_3c,su);
      local_48 = (ulong)(local_3c.m_int & (uint)u & (uint)su.m_int);
      SafeInt::operator_cast_to_unsigned_int((SafeInt *)&local_48);
      local_48 = u & 0xffffffff | su.m_int;
      local_3c.m_int = (uint)su.m_int & (uint)u & local_3c.m_int & st2.m_int;
      SafeInt::operator_cast_to_unsigned_int((SafeInt *)&local_48);
      local_3c.m_int = (uint)su.m_int | (uint)u | local_3c.m_int | st2.m_int;
      local_48 = (local_3c.m_int ^ (uint)u) ^ su.m_int;
      SafeInt::operator_cast_to_unsigned_int((SafeInt *)&local_48);
      return;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}